

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int commission_handshake_secret(ptls_t *tls)

{
  int iVar1;
  ptls_t *in_RDI;
  int is_enc;
  int in_stack_0000001c;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  int in_stack_00000034;
  ptls_t *in_stack_00000038;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *local_18;
  
  iVar1 = ptls_is_server(in_RDI);
  if (in_RDI->pending_handshake_secret != (uint8_t *)0x0) {
    if (iVar1 == 0) {
      local_18 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                 &(in_RDI->traffic_protection).enc;
    }
    else {
      local_18 = &in_RDI->traffic_protection;
    }
    memcpy(local_18,in_RDI->pending_handshake_secret,0x40);
    (*ptls_clear_memory)(in_RDI->pending_handshake_secret,0x40);
    free(in_RDI->pending_handshake_secret);
    in_RDI->pending_handshake_secret = (uint8_t *)0x0;
    iVar1 = setup_traffic_protection
                      (in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020,
                       in_stack_0000001c);
    return iVar1;
  }
  __assert_fail("tls->pending_handshake_secret != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x4d7,"int commission_handshake_secret(ptls_t *)");
}

Assistant:

static int commission_handshake_secret(ptls_t *tls)
{
    int is_enc = !ptls_is_server(tls);

    assert(tls->pending_handshake_secret != NULL);
    memcpy((is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec)->secret, tls->pending_handshake_secret,
           PTLS_MAX_DIGEST_SIZE);
    ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
    free(tls->pending_handshake_secret);
    tls->pending_handshake_secret = NULL;

    return setup_traffic_protection(tls, is_enc, NULL, 2, 1);
}